

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

ExprTree * __thiscall PcodeCompile::createLoad(PcodeCompile *this,StarQuality *qual,ExprTree *ptr)

{
  ExprTree *off;
  OpTpl *pOVar1;
  VarnodeTpl *this_00;
  AddrSpace *this_01;
  ConstTpl local_a8;
  ConstTpl local_88;
  ConstTpl local_68;
  VarnodeTpl *local_48;
  VarnodeTpl *spcvn;
  OpTpl *local_30;
  OpTpl *op;
  VarnodeTpl *outvn;
  ExprTree *ptr_local;
  StarQuality *qual_local;
  PcodeCompile *this_local;
  
  outvn = (VarnodeTpl *)ptr;
  ptr_local = (ExprTree *)qual;
  qual_local = (StarQuality *)this;
  op = (OpTpl *)buildTemporary(this);
  pOVar1 = (OpTpl *)operator_new(0x28);
  OpTpl::OpTpl(pOVar1,CPUI_LOAD);
  local_30 = pOVar1;
  this_00 = (VarnodeTpl *)operator_new(0x68);
  ConstTpl::ConstTpl(&local_68,this->constantspace);
  off = ptr_local;
  ConstTpl::ConstTpl(&local_88,real,8);
  VarnodeTpl::VarnodeTpl(this_00,&local_68,(ConstTpl *)off,&local_88);
  local_48 = this_00;
  OpTpl::addInput(local_30,this_00);
  OpTpl::addInput(local_30,(VarnodeTpl *)(outvn->space).value.spaceid);
  OpTpl::setOutput(local_30,(VarnodeTpl *)op);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back
            (*(vector<OpTpl_*,_std::allocator<OpTpl_*>_> **)&outvn->space,&local_30);
  pOVar1 = op;
  if (*(int *)&ptr_local[2].ops != 0) {
    ConstTpl::ConstTpl(&local_a8,real,(ulong)*(uint *)&ptr_local[2].ops);
    force_size((VarnodeTpl *)pOVar1,&local_a8,
               *(vector<OpTpl_*,_std::allocator<OpTpl_*>_> **)&outvn->space);
  }
  this_01 = (AddrSpace *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl((VarnodeTpl *)this_01,(VarnodeTpl *)op);
  (outvn->space).value.spaceid = this_01;
  if (ptr_local != (ExprTree *)0x0) {
    operator_delete(ptr_local);
  }
  return (ExprTree *)outvn;
}

Assistant:

ExprTree *PcodeCompile::createLoad(StarQuality *qual,ExprTree *ptr)

{				// Create new load expression, free ptr expression
  VarnodeTpl *outvn = buildTemporary();
  OpTpl *op = new OpTpl(CPUI_LOAD);
  // The first varnode input to the load is a constant reference to the AddrSpace being loaded
  // from.  Internally, we really store the pointer to the AddrSpace as the reference, but this
  // isn't platform independent. So officially, we assume that the constant reference will be the
  // AddrSpace index.  We can safely assume this always has size 4.
  VarnodeTpl *spcvn = new VarnodeTpl(ConstTpl(constantspace),
				     qual->id,
				     ConstTpl(ConstTpl::real,8));
  op->addInput(spcvn);
  op->addInput(ptr->outvn);
  op->setOutput(outvn);
  ptr->ops->push_back(op);
  if (qual->size > 0)
    force_size(outvn,ConstTpl(ConstTpl::real,qual->size),*ptr->ops);
  ptr->outvn = new VarnodeTpl(*outvn);
  delete qual;
  return ptr;
}